

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusAnalyzer.cpp
# Opt level: O0

void __thiscall ModbusAnalyzer::~ModbusAnalyzer(ModbusAnalyzer *this)

{
  ModbusAnalyzer *this_local;
  
  *(undefined ***)this = &PTR__ModbusAnalyzer_00134ca0;
  Analyzer::KillThread();
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&this->mSampleOffsets);
  ModbusSimulationDataGenerator::~ModbusSimulationDataGenerator(&this->mSimulationDataGenerator);
  std::auto_ptr<ModbusAnalyzerResults>::~auto_ptr(&this->mResults);
  std::auto_ptr<ModbusAnalyzerSettings>::~auto_ptr(&this->mSettings);
  Analyzer2::~Analyzer2(&this->super_Analyzer2);
  return;
}

Assistant:

ModbusAnalyzer::~ModbusAnalyzer()
{
    KillThread();
}